

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O0

bool __thiscall
cmTargetLinkLibrariesCommand::InitialPass
          (cmTargetLinkLibrariesCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  MessageType t_00;
  bool bVar2;
  __type _Var3;
  PolicyStatus PVar4;
  TargetType TVar5;
  int iVar6;
  const_reference pvVar7;
  cmake *this_00;
  cmGlobalGenerator *this_01;
  cmTarget *pcVar8;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> *this_02;
  reference ppcVar9;
  ostream *poVar10;
  size_type sVar11;
  string *psVar12;
  ulong uVar13;
  char *pcVar14;
  PolicyID id;
  PolicyID id_00;
  PolicyID id_01;
  allocator<char> local_789;
  string local_788;
  byte local_763;
  byte local_762;
  allocator<char> local_761;
  string local_760;
  PolicyStatus local_73c;
  undefined1 local_738 [4];
  PolicyStatus policy22Status;
  ostringstream local_718 [8];
  ostringstream e_2;
  char *linkTypeString;
  string linkType;
  string local_570;
  allocator<char> local_549;
  string local_548;
  allocator<char> local_521;
  string local_520;
  allocator<char> local_4f9;
  string local_4f8;
  allocator<char> local_4d1;
  string local_4d0;
  allocator<char> local_4a9;
  string local_4a8;
  uint local_488;
  byte local_481;
  uint i;
  uint uStack_47c;
  bool haveLLT;
  cmTargetLinkLibraryType llt;
  string local_458;
  MessageType local_434;
  char *pcStack_430;
  MessageType messageType;
  char *modal;
  ostringstream e_1;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  undefined1 local_230 [8];
  ostringstream e;
  int local_b4;
  MessageType t;
  cmTarget *importedTarget;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> *__range2;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> *importedTargets;
  string local_80;
  allocator<char> local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmTargetLinkLibrariesCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    this_local._7_1_ = 0;
    goto LAB_00313890;
  }
  pcVar1 = (this->super_cmCommand).Makefile;
  pvVar7 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local,0);
  bVar2 = cmMakefile::IsAlias(pcVar1,pvVar7);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"can not be used on an ALIAS target.",
               (allocator<char> *)((long)&importedTargets + 7));
    cmCommand::SetError(&this->super_cmCommand,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)((long)&importedTargets + 7));
    this_local._7_1_ = 0;
    goto LAB_00313890;
  }
  this_00 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
  this_01 = cmake::GetGlobalGenerator(this_00);
  pvVar7 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local,0);
  pcVar8 = cmGlobalGenerator::FindTarget(this_01,pvVar7,false);
  this->Target = pcVar8;
  if (this->Target == (cmTarget *)0x0) {
    this_02 = cmMakefile::GetOwnedImportedTargets((this->super_cmCommand).Makefile);
    __end2 = std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::begin(this_02);
    importedTarget = (cmTarget *)std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::end(this_02);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<cmTarget_*const_*,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_>
                                       *)&importedTarget), bVar2) {
      ppcVar9 = __gnu_cxx::
                __normal_iterator<cmTarget_*const_*,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_>
                ::operator*(&__end2);
      pcVar8 = *ppcVar9;
      psVar12 = cmTarget::GetName_abi_cxx11_(pcVar8);
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,0);
      _Var3 = std::operator==(psVar12,pvVar7);
      if (_Var3) {
        this->Target = pcVar8;
        break;
      }
      __gnu_cxx::
      __normal_iterator<cmTarget_*const_*,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_>::
      operator++(&__end2);
    }
  }
  if (this->Target == (cmTarget *)0x0) {
    local_b4 = 2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
    poVar10 = std::operator<<((ostream *)local_230,"Cannot specify link libraries for target \"");
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,0);
    poVar10 = std::operator<<(poVar10,(string *)pvVar7);
    poVar10 = std::operator<<(poVar10,"\" ");
    std::operator<<(poVar10,"which is not built by this project.");
    sVar11 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)param_2_local);
    if (sVar11 < 2) {
      PVar4 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0016,false);
      switch(PVar4) {
      case OLD:
        local_b4 = 4;
        break;
      case WARN:
        local_b4 = 0;
        poVar10 = std::operator<<((ostream *)local_230,"\n");
        poVar10 = std::operator<<(poVar10,
                                  "CMake does not support this but it used to work accidentally ");
        poVar10 = std::operator<<(poVar10,"and is being allowed for compatibility.");
        poVar10 = std::operator<<(poVar10,"\n");
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_250,(cmPolicies *)0x10,id);
        std::operator<<(poVar10,(string *)&local_250);
        std::__cxx11::string::~string((string *)&local_250);
        break;
      case NEW:
        break;
      case REQUIRED_IF_USED:
      case REQUIRED_ALWAYS:
        poVar10 = std::operator<<((ostream *)local_230,"\n");
        cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_270,(cmPolicies *)0x10,id_00);
        std::operator<<(poVar10,(string *)&local_270);
        std::__cxx11::string::~string((string *)&local_270);
      }
    }
    if (local_b4 == 0) {
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_290);
      std::__cxx11::string::~string((string *)&local_290);
    }
    else if (local_b4 == 2) {
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
      cmSystemTools::SetFatalErrorOccured();
    }
    this_local._7_1_ = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_230);
    goto LAB_00313890;
  }
  TVar5 = cmTarget::GetType(this->Target);
  if (TVar5 == UTILITY) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&modal);
    pcStack_430 = (char *)0x0;
    local_434 = AUTHOR_WARNING;
    PVar4 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0039,false);
    if (PVar4 != OLD) {
      if (PVar4 == WARN) {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_458,(cmPolicies *)0x27,id_01);
        poVar10 = std::operator<<((ostream *)&modal,(string *)&local_458);
        std::operator<<(poVar10,"\n");
        std::__cxx11::string::~string((string *)&local_458);
        pcStack_430 = "should";
      }
      else if (PVar4 - NEW < 3) {
        pcStack_430 = "must";
        local_434 = FATAL_ERROR;
      }
    }
    if (pcStack_430 == (char *)0x0) {
LAB_00312b1d:
      uStack_47c = 0;
    }
    else {
      poVar10 = std::operator<<((ostream *)&modal,"Utility target \"");
      psVar12 = cmTarget::GetName_abi_cxx11_(this->Target);
      poVar10 = std::operator<<(poVar10,(string *)psVar12);
      poVar10 = std::operator<<(poVar10,"\" ");
      poVar10 = std::operator<<(poVar10,pcStack_430);
      std::operator<<(poVar10," not be used as the target of a target_link_libraries call.");
      t_00 = local_434;
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,t_00,(string *)&llt);
      std::__cxx11::string::~string((string *)&llt);
      if (local_434 != FATAL_ERROR) goto LAB_00312b1d;
      this_local._7_1_ = 0;
      uStack_47c = 1;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&modal);
    if (uStack_47c != 0) goto LAB_00313890;
  }
  sVar11 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)param_2_local);
  if (sVar11 < 2) {
    this_local._7_1_ = 1;
  }
  else {
    i = 0;
    local_481 = 0;
    this->CurrentProcessingState = ProcessingLinkLibraries;
    for (local_488 = 1; uVar13 = (ulong)local_488,
        sVar11 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local), uVar13 < sVar11; local_488 = local_488 + 1) {
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,(ulong)local_488);
      bVar2 = std::operator==(pvVar7,"LINK_INTERFACE_LIBRARIES");
      if (bVar2) {
        this->CurrentProcessingState = ProcessingPlainLinkInterface;
        if (local_488 != 1) {
          pcVar1 = (this->super_cmCommand).Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4a8,
                     "The LINK_INTERFACE_LIBRARIES option must appear as the second argument, just after the target name."
                     ,&local_4a9);
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_4a8);
          std::__cxx11::string::~string((string *)&local_4a8);
          std::allocator<char>::~allocator(&local_4a9);
          this_local._7_1_ = 1;
          goto LAB_00313890;
        }
      }
      else {
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local,(ulong)local_488);
        bVar2 = std::operator==(pvVar7,"INTERFACE");
        if (bVar2) {
          if (((local_488 != 1) &&
              (this->CurrentProcessingState != ProcessingKeywordPrivateInterface)) &&
             ((this->CurrentProcessingState != ProcessingKeywordPublicInterface &&
              (this->CurrentProcessingState != ProcessingKeywordLinkInterface)))) {
            pcVar1 = (this->super_cmCommand).Makefile;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4d0,
                       "The INTERFACE, PUBLIC or PRIVATE option must appear as the second argument, just after the target name."
                       ,&local_4d1);
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_4d0);
            std::__cxx11::string::~string((string *)&local_4d0);
            std::allocator<char>::~allocator(&local_4d1);
            this_local._7_1_ = 1;
            goto LAB_00313890;
          }
          this->CurrentProcessingState = ProcessingKeywordLinkInterface;
        }
        else {
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)param_2_local,(ulong)local_488);
          bVar2 = std::operator==(pvVar7,"LINK_PUBLIC");
          if (bVar2) {
            if (((local_488 != 1) &&
                (this->CurrentProcessingState != ProcessingPlainPrivateInterface)) &&
               (this->CurrentProcessingState != ProcessingPlainPublicInterface)) {
              pcVar1 = (this->super_cmCommand).Makefile;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4f8,
                         "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second argument, just after the target name."
                         ,&local_4f9);
              cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_4f8);
              std::__cxx11::string::~string((string *)&local_4f8);
              std::allocator<char>::~allocator(&local_4f9);
              this_local._7_1_ = 1;
              goto LAB_00313890;
            }
            this->CurrentProcessingState = ProcessingPlainPublicInterface;
          }
          else {
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)param_2_local,(ulong)local_488);
            bVar2 = std::operator==(pvVar7,"PUBLIC");
            if (bVar2) {
              if ((((local_488 != 1) &&
                   (this->CurrentProcessingState != ProcessingKeywordPrivateInterface)) &&
                  (this->CurrentProcessingState != ProcessingKeywordPublicInterface)) &&
                 (this->CurrentProcessingState != ProcessingKeywordLinkInterface)) {
                pcVar1 = (this->super_cmCommand).Makefile;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_520,
                           "The INTERFACE, PUBLIC or PRIVATE option must appear as the second argument, just after the target name."
                           ,&local_521);
                cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_520);
                std::__cxx11::string::~string((string *)&local_520);
                std::allocator<char>::~allocator(&local_521);
                this_local._7_1_ = 1;
                goto LAB_00313890;
              }
              this->CurrentProcessingState = ProcessingKeywordPublicInterface;
            }
            else {
              pvVar7 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)param_2_local,(ulong)local_488);
              bVar2 = std::operator==(pvVar7,"LINK_PRIVATE");
              if (bVar2) {
                if (((local_488 != 1) &&
                    (this->CurrentProcessingState != ProcessingPlainPublicInterface)) &&
                   (this->CurrentProcessingState != ProcessingPlainPrivateInterface)) {
                  pcVar1 = (this->super_cmCommand).Makefile;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_548,
                             "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second argument, just after the target name."
                             ,&local_549);
                  cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_548);
                  std::__cxx11::string::~string((string *)&local_548);
                  std::allocator<char>::~allocator(&local_549);
                  this_local._7_1_ = 1;
                  goto LAB_00313890;
                }
                this->CurrentProcessingState = ProcessingPlainPrivateInterface;
              }
              else {
                pvVar7 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)param_2_local,(ulong)local_488);
                bVar2 = std::operator==(pvVar7,"PRIVATE");
                if (bVar2) {
                  if (((local_488 != 1) &&
                      (this->CurrentProcessingState != ProcessingKeywordPrivateInterface)) &&
                     ((this->CurrentProcessingState != ProcessingKeywordPublicInterface &&
                      (this->CurrentProcessingState != ProcessingKeywordLinkInterface)))) {
                    pcVar1 = (this->super_cmCommand).Makefile;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_570,
                               "The INTERFACE, PUBLIC or PRIVATE option must appear as the second argument, just after the target name."
                               ,(allocator<char> *)(linkType.field_2._M_local_buf + 0xf));
                    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_570);
                    std::__cxx11::string::~string((string *)&local_570);
                    std::allocator<char>::~allocator
                              ((allocator<char> *)(linkType.field_2._M_local_buf + 0xf));
                    this_local._7_1_ = 1;
                    goto LAB_00313890;
                  }
                  this->CurrentProcessingState = ProcessingKeywordPrivateInterface;
                }
                else {
                  pvVar7 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)param_2_local,(ulong)local_488);
                  bVar2 = std::operator==(pvVar7,"debug");
                  if (bVar2) {
                    if ((local_481 & 1) != 0) {
                      LinkLibraryTypeSpecifierWarning(this,i,1);
                    }
                    i = 1;
                    local_481 = 1;
                  }
                  else {
                    pvVar7 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)param_2_local,(ulong)local_488);
                    bVar2 = std::operator==(pvVar7,"optimized");
                    if (bVar2) {
                      if ((local_481 & 1) != 0) {
                        LinkLibraryTypeSpecifierWarning(this,i,2);
                      }
                      i = 2;
                      local_481 = 1;
                    }
                    else {
                      pvVar7 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)param_2_local,(ulong)local_488);
                      bVar2 = std::operator==(pvVar7,"general");
                      if (bVar2) {
                        if ((local_481 & 1) != 0) {
                          LinkLibraryTypeSpecifierWarning(this,i,0);
                        }
                        i = 0;
                        local_481 = 1;
                      }
                      else if ((local_481 & 1) == 0) {
                        i = 0;
                        pvVar7 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)param_2_local,0);
                        std::__cxx11::string::string((string *)&linkTypeString,(string *)pvVar7);
                        std::__cxx11::string::operator+=((string *)&linkTypeString,"_LINK_TYPE");
                        pcVar14 = cmMakefile::GetDefinition
                                            ((this->super_cmCommand).Makefile,
                                             (string *)&linkTypeString);
                        if (pcVar14 != (char *)0x0) {
                          iVar6 = strcmp(pcVar14,"debug");
                          if (iVar6 == 0) {
                            i = 1;
                          }
                          iVar6 = strcmp(pcVar14,"optimized");
                          if (iVar6 == 0) {
                            i = 2;
                          }
                        }
                        pvVar7 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)param_2_local,(ulong)local_488);
                        bVar2 = HandleLibrary(this,pvVar7,i);
                        if (!bVar2) {
                          this_local._7_1_ = 0;
                        }
                        uStack_47c = (uint)!bVar2;
                        std::__cxx11::string::~string((string *)&linkTypeString);
                        if (uStack_47c != 0) goto LAB_00313890;
                      }
                      else {
                        local_481 = 0;
                        pvVar7 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)param_2_local,(ulong)local_488);
                        bVar2 = HandleLibrary(this,pvVar7,i);
                        if (!bVar2) {
                          this_local._7_1_ = 0;
                          goto LAB_00313890;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if ((local_481 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_718);
      poVar10 = std::operator<<((ostream *)local_718,"The \"");
      poVar10 = std::operator<<(poVar10,LinkLibraryTypeNames[i]);
      std::operator<<(poVar10,"\" argument must be followed by a library.");
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_738);
      std::__cxx11::string::~string((string *)local_738);
      cmSystemTools::SetFatalErrorOccured();
      std::__cxx11::ostringstream::~ostringstream(local_718);
    }
    local_73c = cmTarget::GetPolicyStatusCMP0022(this->Target);
    local_762 = 0;
    local_763 = 0;
    if (((local_73c == OLD) || (bVar2 = false, local_73c == WARN)) &&
       (bVar2 = false, this->CurrentProcessingState != ProcessingLinkLibraries)) {
      pcVar8 = this->Target;
      std::allocator<char>::allocator();
      local_762 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_760,"LINK_INTERFACE_LIBRARIES",&local_761);
      local_763 = 1;
      pcVar14 = cmTarget::GetProperty(pcVar8,&local_760);
      bVar2 = pcVar14 == (char *)0x0;
    }
    if ((local_763 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_760);
    }
    if ((local_762 & 1) != 0) {
      std::allocator<char>::~allocator(&local_761);
    }
    if (bVar2) {
      pcVar8 = this->Target;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_788,"LINK_INTERFACE_LIBRARIES",&local_789);
      cmTarget::SetProperty(pcVar8,&local_788,"");
      std::__cxx11::string::~string((string *)&local_788);
      std::allocator<char>::~allocator(&local_789);
    }
    this_local._7_1_ = 1;
  }
LAB_00313890:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmTargetLinkLibrariesCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  // Must have at least one argument.
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  // Alias targets cannot be on the LHS of this command.
  if (this->Makefile->IsAlias(args[0])) {
    this->SetError("can not be used on an ALIAS target.");
    return false;
  }

  // Lookup the target for which libraries are specified.
  this->Target =
    this->Makefile->GetCMakeInstance()->GetGlobalGenerator()->FindTarget(
      args[0]);
  if (!this->Target) {
    const std::vector<cmTarget*>& importedTargets =
      this->Makefile->GetOwnedImportedTargets();
    for (cmTarget* importedTarget : importedTargets) {
      if (importedTarget->GetName() == args[0]) {
        this->Target = importedTarget;
        break;
      }
    }
  }
  if (!this->Target) {
    MessageType t = MessageType::FATAL_ERROR; // fail by default
    std::ostringstream e;
    e << "Cannot specify link libraries for target \"" << args[0] << "\" "
      << "which is not built by this project.";
    // The bad target is the only argument. Check how policy CMP0016 is set,
    // and accept, warn or fail respectively:
    if (args.size() < 2) {
      switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0016)) {
        case cmPolicies::WARN:
          t = MessageType::AUTHOR_WARNING;
          // Print the warning.
          e << "\n"
            << "CMake does not support this but it used to work accidentally "
            << "and is being allowed for compatibility."
            << "\n"
            << cmPolicies::GetPolicyWarning(cmPolicies::CMP0016);
          break;
        case cmPolicies::OLD: // OLD behavior does not warn.
          t = MessageType::MESSAGE;
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
          e << "\n" << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0016);
          break;
        case cmPolicies::NEW: // NEW behavior prints the error.
          break;
      }
    }
    // Now actually print the message.
    switch (t) {
      case MessageType::AUTHOR_WARNING:
        this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
        break;
      case MessageType::FATAL_ERROR:
        this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
        cmSystemTools::SetFatalErrorOccured();
        break;
      default:
        break;
    }
    return true;
  }

  // Having a UTILITY library on the LHS is a bug.
  if (this->Target->GetType() == cmStateEnums::UTILITY) {
    std::ostringstream e;
    const char* modal = nullptr;
    MessageType messageType = MessageType::AUTHOR_WARNING;
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0039)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0039) << "\n";
        modal = "should";
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        modal = "must";
        messageType = MessageType::FATAL_ERROR;
    }
    if (modal) {
      e << "Utility target \"" << this->Target->GetName() << "\" " << modal
        << " not be used as the target of a target_link_libraries call.";
      this->Makefile->IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
  }

  // But we might not have any libs after variable expansion.
  if (args.size() < 2) {
    return true;
  }

  // Keep track of link configuration specifiers.
  cmTargetLinkLibraryType llt = GENERAL_LibraryType;
  bool haveLLT = false;

  // Start with primary linking and switch to link interface
  // specification if the keyword is encountered as the first argument.
  this->CurrentProcessingState = ProcessingLinkLibraries;

  // Add libraries, note that there is an optional prefix
  // of debug and optimized that can be used.
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "LINK_INTERFACE_LIBRARIES") {
      this->CurrentProcessingState = ProcessingPlainLinkInterface;
      if (i != 1) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "The LINK_INTERFACE_LIBRARIES option must appear as the second "
          "argument, just after the target name.");
        return true;
      }
    } else if (args[i] == "INTERFACE") {
      if (i != 1 &&
          this->CurrentProcessingState != ProcessingKeywordPrivateInterface &&
          this->CurrentProcessingState != ProcessingKeywordPublicInterface &&
          this->CurrentProcessingState != ProcessingKeywordLinkInterface) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "The INTERFACE, PUBLIC or PRIVATE option must appear as the second "
          "argument, just after the target name.");
        return true;
      }
      this->CurrentProcessingState = ProcessingKeywordLinkInterface;
    } else if (args[i] == "LINK_PUBLIC") {
      if (i != 1 &&
          this->CurrentProcessingState != ProcessingPlainPrivateInterface &&
          this->CurrentProcessingState != ProcessingPlainPublicInterface) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second "
          "argument, just after the target name.");
        return true;
      }
      this->CurrentProcessingState = ProcessingPlainPublicInterface;
    } else if (args[i] == "PUBLIC") {
      if (i != 1 &&
          this->CurrentProcessingState != ProcessingKeywordPrivateInterface &&
          this->CurrentProcessingState != ProcessingKeywordPublicInterface &&
          this->CurrentProcessingState != ProcessingKeywordLinkInterface) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "The INTERFACE, PUBLIC or PRIVATE option must appear as the second "
          "argument, just after the target name.");
        return true;
      }
      this->CurrentProcessingState = ProcessingKeywordPublicInterface;
    } else if (args[i] == "LINK_PRIVATE") {
      if (i != 1 &&
          this->CurrentProcessingState != ProcessingPlainPublicInterface &&
          this->CurrentProcessingState != ProcessingPlainPrivateInterface) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second "
          "argument, just after the target name.");
        return true;
      }
      this->CurrentProcessingState = ProcessingPlainPrivateInterface;
    } else if (args[i] == "PRIVATE") {
      if (i != 1 &&
          this->CurrentProcessingState != ProcessingKeywordPrivateInterface &&
          this->CurrentProcessingState != ProcessingKeywordPublicInterface &&
          this->CurrentProcessingState != ProcessingKeywordLinkInterface) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "The INTERFACE, PUBLIC or PRIVATE option must appear as the second "
          "argument, just after the target name.");
        return true;
      }
      this->CurrentProcessingState = ProcessingKeywordPrivateInterface;
    } else if (args[i] == "debug") {
      if (haveLLT) {
        this->LinkLibraryTypeSpecifierWarning(llt, DEBUG_LibraryType);
      }
      llt = DEBUG_LibraryType;
      haveLLT = true;
    } else if (args[i] == "optimized") {
      if (haveLLT) {
        this->LinkLibraryTypeSpecifierWarning(llt, OPTIMIZED_LibraryType);
      }
      llt = OPTIMIZED_LibraryType;
      haveLLT = true;
    } else if (args[i] == "general") {
      if (haveLLT) {
        this->LinkLibraryTypeSpecifierWarning(llt, GENERAL_LibraryType);
      }
      llt = GENERAL_LibraryType;
      haveLLT = true;
    } else if (haveLLT) {
      // The link type was specified by the previous argument.
      haveLLT = false;
      if (!this->HandleLibrary(args[i], llt)) {
        return false;
      }
    } else {
      // Lookup old-style cache entry if type is unspecified.  So if you
      // do a target_link_libraries(foo optimized bar) it will stay optimized
      // and not use the lookup.  As there may be the case where someone has
      // specified that a library is both debug and optimized.  (this check is
      // only there for backwards compatibility when mixing projects built
      // with old versions of CMake and new)
      llt = GENERAL_LibraryType;
      std::string linkType = args[0];
      linkType += "_LINK_TYPE";
      const char* linkTypeString = this->Makefile->GetDefinition(linkType);
      if (linkTypeString) {
        if (strcmp(linkTypeString, "debug") == 0) {
          llt = DEBUG_LibraryType;
        }
        if (strcmp(linkTypeString, "optimized") == 0) {
          llt = OPTIMIZED_LibraryType;
        }
      }
      if (!this->HandleLibrary(args[i], llt)) {
        return false;
      }
    }
  }

  // Make sure the last argument was not a library type specifier.
  if (haveLLT) {
    std::ostringstream e;
    e << "The \"" << cmTargetLinkLibrariesCommand::LinkLibraryTypeNames[llt]
      << "\" argument must be followed by a library.";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccured();
  }

  const cmPolicies::PolicyStatus policy22Status =
    this->Target->GetPolicyStatusCMP0022();

  // If any of the LINK_ options were given, make sure the
  // LINK_INTERFACE_LIBRARIES target property exists.
  // Use of any of the new keywords implies awareness of
  // this property. And if no libraries are named, it should
  // result in an empty link interface.
  if ((policy22Status == cmPolicies::OLD ||
       policy22Status == cmPolicies::WARN) &&
      this->CurrentProcessingState != ProcessingLinkLibraries &&
      !this->Target->GetProperty("LINK_INTERFACE_LIBRARIES")) {
    this->Target->SetProperty("LINK_INTERFACE_LIBRARIES", "");
  }

  return true;
}